

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::binary16::writer<std::wostream>
          (binary16 *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind)

{
  bool bVar1;
  byte *pbVar2;
  wchar_t *pwVar3;
  wostream *pwVar4;
  undefined1 local_50 [8];
  array<wchar_t,_3UL> hex;
  uint8_t b;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range3;
  uint byte_no;
  uint bytes_per_row;
  indent *ind_local;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os_local;
  binary16 *this_local;
  
  std::operator<<(os,"!!binary16 |");
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->v_);
  if (bVar1) {
    pwVar4 = std::operator<<(os,'\n');
    dump::operator<<(pwVar4,ind);
  }
  else {
    __range3._0_4_ = 0;
    __end3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->v_);
    register0x00000000 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->v_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)(hex._M_elems + 2)), bVar1) {
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end3);
      hex._M_elems[1]._3_1_ = *pbVar2;
      if (((uint)__range3 == 0) || (0xf < (uint)__range3)) {
        pwVar4 = std::operator<<(os,'\n');
        dump::operator<<(pwVar4,ind);
        __range3._0_4_ = 0;
      }
      else if (((uint)__range3 & 1) == 0) {
        std::operator<<(os,' ');
      }
      local_50._0_4_ =
           anon_unknown.dwarf_94f4e::to_hex<wchar_t>((int)(uint)hex._M_elems[1]._3_1_ >> 4);
      local_50._4_4_ = anon_unknown.dwarf_94f4e::to_hex<wchar_t>(hex._M_elems[1]._3_1_ & 0xf);
      hex._M_elems[0] = L'\0';
      pwVar3 = std::array<wchar_t,_3UL>::data((array<wchar_t,_3UL> *)local_50);
      std::operator<<(os,pwVar3);
      __range3._0_4_ = (uint)__range3 + 1;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end3);
    }
  }
  pwVar4 = std::operator<<(os,'>');
  return pwVar4;
}

Assistant:

OStream & binary16::writer (OStream & os, indent const & ind) const {
            os << "!!binary16 |";
            if (v_.empty ()) {
                os << '\n' << ind;
            } else {
                using char_type = typename OStream::char_type;
                constexpr auto bytes_per_row = 8U * 2U;
                auto byte_no = 0U;
                for (std::uint8_t const b : v_) {
                    if (byte_no == 0U || byte_no >= bytes_per_row) {
                        // Line wrap and indent on the first iteration or when we run out of width.
                        os << '\n' << ind;
                        byte_no = 0U;
                    } else if (byte_no % 2U == 0U) {
                        // Values grouped into two-byte pairs.
                        os << ' ';
                    }
                    std::array<char_type, 3> const hex{{to_hex<char_type> ((b >> 4U) & 0x0FU),
                                                        to_hex<char_type> (b & 0x0FU), '\0'}};
                    os << hex.data ();
                    ++byte_no;
                }
            }
            return os << '>';
        }